

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDMeshFragment * __thiscall
ON_SubDMeshImpl::CopyCallbackFragment(ON_SubDMeshImpl *this,ON_SubDMeshFragment *callback_fragment)

{
  uint uVar1;
  ON_SubDMeshFragment *this_00;
  ON__UINT64 OVar2;
  
  if ((((callback_fragment != (ON_SubDMeshFragment *)0x0) &&
       ((callback_fragment->m_vertex_count_etc & 0x1fff) != 0)) &&
      ((callback_fragment->m_vertex_count_etc & 0x1fff) <= this->m_fragment_point_count)) &&
     (((uVar1 = ON_SubDMeshFragment::PointCount(callback_fragment), uVar1 != 0 &&
       (uVar1 = ON_SubDMeshFragment::NormalCount(callback_fragment), uVar1 != 0)) &&
      (this_00 = (ON_SubDMeshFragment *)ON_FixedSizePool::AllocateElement(&this->m_fsp),
      this_00 != (ON_SubDMeshFragment *)0x0)))) {
    ON_SubDMeshFragment::Internal_LayoutArrays
              (this_00,(ulong)this->m_fragment_point_count,(double *)(this_00 + 1));
    ON_SubDMeshFragment::CopyFrom(this_00,callback_fragment);
    OVar2 = ON_NextContentSerialNumber();
    this->m_mesh_content_serial_number = OVar2;
    return this_00;
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDMeshFragment *)0x0;
}

Assistant:

ON_SubDMeshFragment* ON_SubDMeshImpl::CopyCallbackFragment(
    const ON_SubDMeshFragment* callback_fragment
    )
{
  if ( nullptr == callback_fragment)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( 0 == callback_fragment->VertexCount() )
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( callback_fragment->VertexCount() > m_fragment_point_count )
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( 0 == callback_fragment->PointCount() || 0 == callback_fragment->NormalCount() )
    return ON_SUBD_RETURN_ERROR(nullptr);

  // m_fsp.AllocateElement() allocates room for the fragment and the m_P[], m_N[], m_T[], m_C[], and m_K[] (as needed) arrays.
  ON_SubDMeshFragment* fragment = (ON_SubDMeshFragment*)m_fsp.AllocateElement();
  if ( nullptr == fragment)
    return ON_SUBD_RETURN_ERROR(nullptr);

  // The memory for the arrays in this case is managed by m_fsp[].
  fragment->Internal_LayoutArrays(m_fragment_point_count, (double*)(fragment + 1) );
  fragment->CopyFrom(*callback_fragment);

  ChangeContentSerialNumber();

  return fragment;
}